

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<VkQueue_T_*> * __thiscall
vkb::Device::get_dedicated_queue
          (Result<VkQueue_T_*> *__return_storage_ptr__,Device *this,QueueType type)

{
  PFN_vkGetDeviceQueue p_Var1;
  VkDevice pVVar2;
  bool bVar3;
  uint *puVar4;
  error_code eVar5;
  VkQueue local_70;
  VkQueue out_queue;
  uint local_60;
  error_category *local_58;
  undefined1 local_40 [8];
  Result<unsigned_int> index;
  QueueType type_local;
  Device *this_local;
  
  index._28_4_ = type;
  get_dedicated_queue_index((Result<unsigned_int> *)local_40,this,type);
  bVar3 = Result<unsigned_int>::has_value((Result<unsigned_int> *)local_40);
  if (bVar3) {
    p_Var1 = (this->internal_table).fp_vkGetDeviceQueue;
    pVVar2 = this->device;
    puVar4 = Result<unsigned_int>::value((Result<unsigned_int> *)local_40);
    (*p_Var1)(pVVar2,*puVar4,0,&local_70);
    Result<VkQueue_T_*>::Result(__return_storage_ptr__,&local_70);
  }
  else {
    eVar5 = Result<unsigned_int>::error((Result<unsigned_int> *)local_40);
    local_60 = eVar5._M_value;
    eVar5._4_4_ = 0;
    eVar5._M_value = local_60;
    local_58 = eVar5._M_cat;
    Result<VkQueue_T_*>::Result(__return_storage_ptr__,eVar5,VK_SUCCESS);
  }
  out_queue._4_4_ = 1;
  Result<unsigned_int>::~Result((Result<unsigned_int> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Result<VkQueue> Device::get_dedicated_queue(QueueType type) const {
    auto index = get_dedicated_queue_index(type);
    if (!index.has_value()) return { index.error() };
    VkQueue out_queue;
    internal_table.fp_vkGetDeviceQueue(device, index.value(), 0, &out_queue);
    return out_queue;
}